

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyUtil.cpp
# Opt level: O0

char * tcu::getNodeTypeName(TestNodeType nodeType)

{
  char *pcStack_10;
  TestNodeType nodeType_local;
  
  switch(nodeType) {
  case NODETYPE_GROUP:
    pcStack_10 = "TestGroup";
    break;
  case NODETYPE_SELF_VALIDATE:
    pcStack_10 = "SelfValidate";
    break;
  case NODETYPE_PERFORMANCE:
    pcStack_10 = "Performance";
    break;
  case NODETYPE_CAPABILITY:
    pcStack_10 = "Capability";
    break;
  case NODETYPE_ACCURACY:
    pcStack_10 = "Accuracy";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static const char* getNodeTypeName (TestNodeType nodeType)
{
	switch (nodeType)
	{
		case NODETYPE_SELF_VALIDATE:	return "SelfValidate";
		case NODETYPE_CAPABILITY:		return "Capability";
		case NODETYPE_ACCURACY:			return "Accuracy";
		case NODETYPE_PERFORMANCE:		return "Performance";
		case NODETYPE_GROUP:			return "TestGroup";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}